

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O3

int VP8LEncodeStream(WebPConfig *config,WebPPicture *picture,VP8LBitWriter *bw_main)

{
  undefined8 *puVar1;
  int *piVar2;
  float fVar3;
  WebPConfig *pWVar4;
  WebPPicture *pic;
  bool bVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  WebPWorker *pWVar11;
  WebPWorker *pWVar12;
  WebPWorker *pWVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  undefined4 uVar19;
  int iVar20;
  VP8LEncoder *enc;
  WebPWorkerInterface *pWVar21;
  uint32_t *ptr;
  uint64_t uVar22;
  byte bVar23;
  int sorting_method;
  int iVar24;
  uint *puVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  uint *puVar29;
  long lVar30;
  ulong *puVar31;
  uint uVar32;
  undefined1 *puVar33;
  long lVar34;
  int iVar35;
  ulong uVar36;
  WebPWorker *pWVar37;
  int in_R8D;
  ulong uVar38;
  int in_R9D;
  ulong uVar39;
  uint *puVar40;
  uint uVar41;
  uint32_t *array;
  ulong uVar42;
  VP8LBitWriter bw_side;
  WebPWorker worker_side;
  WebPWorker worker_main;
  StreamEncodeContext params_main;
  StreamEncodeContext params_side;
  WebPAuxStats stats_side;
  WebPPicture picture_side;
  VP8LEncoder *local_7f8;
  VP8LBitWriter local_788;
  WebPWorker local_758;
  WebPWorker local_728;
  uint64_t local_6f8;
  WebPPicture *local_6f0;
  VP8LBitWriter *local_6e8;
  VP8LEncoder *local_6e0;
  long local_6d8;
  long local_6d0;
  long local_6c8;
  long local_6c0;
  long local_6b8;
  long local_6b0;
  long local_6a8;
  long local_6a0;
  long local_698;
  int local_550;
  WebPAuxStats *local_548;
  ulong local_538;
  WebPPicture *local_530;
  VP8LBitWriter *local_528;
  VP8LEncoder *local_520;
  long local_518;
  undefined8 auStack_50c [47];
  uint local_390;
  WebPAuxStats *local_388;
  uint local_378 [2];
  undefined1 auStack_370 [12];
  undefined8 uStack_364;
  undefined4 local_35c;
  uint local_358 [91];
  WebPAuxStats local_1ec;
  WebPPicture local_130;
  
  enc = VP8LEncoderNew(config,picture);
  pWVar21 = WebPGetWorkerInterface();
  if (enc == (VP8LEncoder *)0x0) {
LAB_0013c0e5:
    iVar14 = WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
    return iVar14;
  }
  iVar14 = VP8LBitWriterInit(&local_788,0);
  if (iVar14 == 0) {
    VP8LEncoderDelete(enc);
    goto LAB_0013c0e5;
  }
  iVar14 = WebPPictureInitInternal(&local_130,0x210);
  local_7f8 = (VP8LEncoder *)0x0;
  if (iVar14 == 0) goto LAB_0013c6fd;
  pWVar4 = enc->config_;
  pic = enc->pic_;
  iVar14 = pWVar4->method;
  uVar18 = pic->width;
  iVar20 = pic->height;
  uVar32 = 6;
  if (3 < iVar14) {
    uVar32 = iVar14 == 4 | 4;
  }
  iVar15 = GetColorPalette(pic,enc->palette_sorted_);
  iVar26 = 0;
  if (iVar15 < 0x101) {
    iVar26 = iVar15;
  }
  enc->palette_size_ = iVar26;
  uVar16 = ClampBits(pic->width,pic->height,((uint)(iVar15 < 0x101) * 2 - iVar14) + 7,0xa28,in_R8D,
                     in_R9D);
  if (uVar16 <= uVar32) {
    uVar32 = uVar16;
  }
  enc->histo_bits_ = uVar16;
  enc->predictor_transform_bits_ = uVar32;
  enc->cross_color_transform_bits_ = uVar32;
  if (iVar14 == 0) {
    puVar25 = local_378 + 1;
    local_378[0] = (iVar15 < 0x101) + 3;
    uVar18 = (uint)(0x100 < iVar15) * 3;
    uVar10 = 0;
    uVar42 = 1;
    uVar19 = 0;
    uVar39 = 1;
LAB_0013c130:
    *puVar25 = uVar18;
    goto LAB_0013c2af;
  }
  uVar10 = 1;
  uVar16 = (iVar26 < 0x11) + 1;
  if (iVar26 < 1) {
    uVar16 = 1;
  }
  uVar28 = 4;
  if (iVar15 < 0x101 && iVar26 < 0x11) {
LAB_0013c154:
    uVar39 = (ulong)uVar16;
    fVar3 = pWVar4->quality;
    if (((iVar14 != 6) || (fVar3 != 100.0)) || (NAN(fVar3))) {
      local_378[1] = (uint)(0x100 < iVar15) * 2 + 1;
      local_378[0] = uVar28;
      if (iVar14 != 5 || fVar3 < 75.0) {
        uVar19 = 0;
        uVar42 = 1;
      }
      else {
        uVar42 = 1;
        if (uVar28 == 4) {
          puVar25 = local_358;
          local_35c = 5;
          uVar42 = 2;
          uVar18 = 1;
          uVar19 = 1;
          goto LAB_0013c130;
        }
        uVar19 = 1;
      }
LAB_0013c2af:
      puVar33 = auStack_370 + 4;
      uVar36 = 0;
      do {
        uVar38 = 0;
        do {
          *(uint *)(puVar33 + uVar38 * 8 + -4) = 4 - (uint)(uVar38 == 0);
          *(undefined4 *)(puVar33 + uVar38 * 8) = uVar19;
          uVar38 = uVar38 + 1;
        } while (uVar39 != uVar38);
        *(int *)((long)&uStack_364 + uVar36 * 0x1c + 4) = (int)uVar39;
        uVar36 = uVar36 + 1;
        puVar33 = puVar33 + 0x1c;
      } while (uVar36 != uVar42);
    }
    else {
      uVar42 = 0;
      uVar18 = 0;
      do {
        if (iVar15 < 0x101 || uVar18 < 4) {
          if ((uVar18 & 6) == 4 && iVar15 < 0x101) {
            iVar14 = 0;
            do {
              if ((iVar14 != 0) && (iVar14 != 3)) {
                iVar20 = (int)uVar42;
                local_378[(long)iVar20 * 7] = uVar18;
                *(int *)(auStack_370 + (long)iVar20 * 0x1c + -4) = iVar14;
                uVar42 = (ulong)(iVar20 + 1);
              }
              iVar14 = iVar14 + 1;
            } while (iVar14 != 4);
          }
          else {
            iVar14 = (int)uVar42;
            local_378[(long)iVar14 * 7] = uVar18;
            *(undefined4 *)(auStack_370 + (long)iVar14 * 0x1c + -4) = 3;
            uVar42 = (ulong)(iVar14 + 1);
          }
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != 6);
      uVar19 = 1;
      if (0 < (int)uVar42) goto LAB_0013c2af;
    }
    iVar14 = EncoderInit(enc);
    if (iVar14 != 0) {
      iVar14 = (int)uVar42;
      if (config->thread_level < 1) {
        uVar18 = 0;
      }
      else {
        uVar18 = (int)(uVar42 >> 0x1f) + iVar14 >> 1;
        local_390 = uVar18;
        if (1 < iVar14) {
          uVar39 = (ulong)uVar18;
          lVar30 = (long)iVar14 * 0x1c + (long)(int)uVar18 * -0x1c;
          lVar34 = 0;
          do {
            puVar1 = (undefined8 *)((long)local_378 + lVar34 + lVar30);
            uVar7 = *puVar1;
            uVar8 = puVar1[1];
            uVar9 = *(undefined8 *)((long)(auStack_370 + lVar34 + lVar30 + 4) + 8);
            *(undefined8 *)((long)auStack_50c + lVar34) =
                 *(undefined8 *)(auStack_370 + lVar34 + lVar30 + 4);
            *(undefined8 *)((long)auStack_50c + lVar34 + 8) = uVar9;
            *(undefined8 *)((long)&local_518 + lVar34) = uVar7;
            *(undefined8 *)(&stack0xfffffffffffffaf0 + lVar34) = uVar8;
            lVar34 = lVar34 + 0x1c;
            uVar39 = uVar39 - 1;
          } while (uVar39 != 0);
        }
      }
      if (iVar14 - uVar18 != 0 && (int)uVar18 <= iVar14) {
        memcpy(&local_6d8,local_378,(ulong)(iVar14 + ~uVar18) * 0x1c + 0x1c);
      }
      bVar6 = true;
      local_7f8 = (VP8LEncoder *)0x0;
      local_550 = iVar14 - uVar18;
      do {
        bVar5 = !bVar6;
        pWVar37 = &local_758;
        if (!bVar5) {
          pWVar37 = &local_728;
        }
        puVar31 = &local_538;
        if (!bVar5) {
          puVar31 = &local_6f8;
        }
        *puVar31 = (ulong)config;
        *(undefined4 *)((long)puVar31 + 0x1ac) = uVar10;
        if (bVar5) {
          WebPPictureView(picture,0,0,picture->width,picture->height,&local_130);
          local_130.progress_hook = (WebPProgressHook)0x0;
          local_388 = picture->stats;
          if (picture->stats != (WebPAuxStats *)0x0) {
            local_388 = &local_1ec;
          }
          local_530 = &local_130;
          iVar14 = VP8LBitWriterClone(bw_main,&local_788);
          if (iVar14 == 0) goto LAB_0013c6ec;
          local_528 = &local_788;
          local_7f8 = VP8LEncoderNew(config,&local_130);
          if ((local_7f8 == (VP8LEncoder *)0x0) || (iVar14 = EncoderInit(local_7f8), iVar14 == 0)) {
            local_130.error_code = VP8_ENC_ERROR_OUT_OF_MEMORY;
            goto LAB_0013c6e5;
          }
          iVar14 = enc->predictor_transform_bits_;
          local_7f8->histo_bits_ = enc->histo_bits_;
          local_7f8->predictor_transform_bits_ = iVar14;
          local_7f8->cross_color_transform_bits_ = enc->cross_color_transform_bits_;
          local_7f8->palette_size_ = enc->palette_size_;
          memcpy(local_7f8->palette_,enc->palette_,0x400);
          memcpy(local_7f8->palette_sorted_,enc->palette_sorted_,0x400);
          pWVar11 = &local_758;
          pWVar12 = &local_758;
          pWVar13 = &local_758;
          local_520 = local_7f8;
        }
        else {
          local_548 = picture->stats;
          pWVar11 = &local_728;
          pWVar12 = &local_728;
          pWVar13 = &local_728;
          local_6f0 = picture;
          local_6e8 = bw_main;
          local_6e0 = enc;
        }
        (*pWVar21->Init)(pWVar37);
        pWVar11->data1 = puVar31;
        pWVar12->data2 = (void *)0x0;
        pWVar13->hook = EncodeStreamHook;
        bVar5 = (bool)(0 < (int)uVar18 & bVar6);
        bVar6 = false;
      } while (bVar5);
      if (uVar18 != 0) {
        iVar14 = (*pWVar21->Reset)(&local_758);
        if (iVar14 == 0) {
LAB_0013c6ec:
          WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
          goto LAB_0013c6fd;
        }
        if (picture->stats != (WebPAuxStats *)0x0) {
          memcpy(&local_1ec,picture->stats,0xbc);
        }
        (*pWVar21->Launch)(&local_758);
      }
      (*pWVar21->Execute)(&local_728);
      iVar14 = (*pWVar21->Sync)(&local_728);
      (*pWVar21->End)(&local_728);
      if (uVar18 != 0) {
        iVar20 = (*pWVar21->Sync)(&local_758);
        (*pWVar21->End)(&local_758);
        if ((iVar14 == 0) || (iVar20 == 0)) {
          if (picture->error_code == VP8_ENC_OK) {
LAB_0013c6e5:
            WebPEncodingSetError(picture,local_130.error_code);
          }
        }
        else if (local_788.cur_ + ((long)(local_788.used_ + 7 >> 3) - (long)local_788.buf_) <
                 bw_main->cur_ + ((long)(bw_main->used_ + 7 >> 3) - (long)bw_main->buf_)) {
          VP8LBitWriterSwap(bw_main,&local_788);
          if (picture->stats != (WebPAuxStats *)0x0) {
            memcpy(picture->stats,&local_1ec,0xbc);
          }
        }
      }
      goto LAB_0013c6fd;
    }
  }
  else {
    puVar25 = pic->argb;
    iVar35 = pic->argb_stride;
    ptr = (uint32_t *)WebPSafeCalloc(0xd,0x400);
    if (ptr != (uint32_t *)0x0) {
      if (0 < iVar20) {
        uVar28 = *puVar25;
        iVar24 = 0;
        puVar40 = (uint *)0x0;
        do {
          puVar29 = puVar25;
          if (0 < (int)uVar18) {
            uVar39 = 0;
            uVar27 = uVar28;
            do {
              uVar28 = puVar29[uVar39];
              uVar17 = (uVar28 | 0xff0000) - (uVar27 & 0xff00ff00);
              uVar27 = (uVar28 | 0xff00) - (uVar27 & 0xff00ff);
              uVar41 = uVar27 & 0xff00ff | uVar17 & 0xff00ff00;
              if ((uVar41 != 0) && ((puVar40 == (uint *)0x0 || (uVar28 != puVar40[uVar39])))) {
                ptr[uVar28 >> 0x18] = ptr[uVar28 >> 0x18] + 1;
                piVar2 = (int *)((long)ptr + (ulong)(uVar28 >> 0xe & 0x3fc) + 0x1000);
                *piVar2 = *piVar2 + 1;
                ptr[(ulong)(uVar28 >> 8 & 0xff) + 0x200] =
                     ptr[(ulong)(uVar28 >> 8 & 0xff) + 0x200] + 1;
                ptr[(ulong)(uVar28 & 0xff) + 0x600] = ptr[(ulong)(uVar28 & 0xff) + 0x600] + 1;
                ptr[(ulong)(uVar17 >> 0x18) + 0x100] = ptr[(ulong)(uVar17 >> 0x18) + 0x100] + 1;
                piVar2 = (int *)((long)ptr + (ulong)((uVar27 & 0xff0000) >> 0xe) + 0x1400);
                *piVar2 = *piVar2 + 1;
                ptr[(ulong)(uVar17 >> 8 & 0xff) + 0x300] =
                     ptr[(ulong)(uVar17 >> 8 & 0xff) + 0x300] + 1;
                ptr[(ulong)(uVar27 & 0xff) + 0x700] = ptr[(ulong)(uVar27 & 0xff) + 0x700] + 1;
                ptr[(ulong)((uVar28 >> 0x10) - ((int)uVar28 >> 8) & 0xff) + 0x800] =
                     ptr[(ulong)((uVar28 >> 0x10) - ((int)uVar28 >> 8) & 0xff) + 0x800] + 1;
                ptr[(ulong)(uVar28 - ((int)uVar28 >> 8) & 0xff) + 0xa00] =
                     ptr[(ulong)(uVar28 - ((int)uVar28 >> 8) & 0xff) + 0xa00] + 1;
                ptr[(ulong)((uVar41 >> 0x10) - ((int)uVar41 >> 8) & 0xff) + 0x900] =
                     ptr[(ulong)((uVar41 >> 0x10) - ((int)uVar41 >> 8) & 0xff) + 0x900] + 1;
                ptr[(ulong)(uVar27 - ((int)uVar41 >> 8) & 0xff) + 0xb00] =
                     ptr[(ulong)(uVar27 - ((int)uVar41 >> 8) & 0xff) + 0xb00] + 1;
                piVar2 = (int *)((long)ptr +
                                (ulong)(((uVar28 >> 0x13) + uVar28) * 0x39c5fba7 >> 0x16 &
                                       0xfffffffc) + 0x3000);
                *piVar2 = *piVar2 + 1;
              }
              uVar39 = uVar39 + 1;
              uVar27 = uVar28;
            } while (uVar18 != uVar39);
          }
          iVar24 = iVar24 + 1;
          puVar25 = puVar29 + iVar35;
          puVar40 = puVar29;
        } while (iVar24 != iVar20);
      }
      ptr[0x900] = ptr[0x900] + 1;
      ptr[0xb00] = ptr[0xb00] + 1;
      ptr[0x500] = ptr[0x500] + 1;
      ptr[0x300] = ptr[0x300] + 1;
      ptr[0x700] = ptr[0x700] + 1;
      ptr[0x100] = ptr[0x100] + 1;
      lVar30 = 0;
      array = ptr;
      do {
        uVar22 = VP8LBitsEntropy(array,0x100);
        (&local_6f8)[lVar30] = uVar22;
        lVar30 = lVar30 + 1;
        array = array + 0x100;
      } while (lVar30 != 0xd);
      local_538 = (long)&local_6e8->bits_ + local_6c8 + local_6d8 + local_6f8;
      bVar23 = (byte)uVar32;
      iVar35 = 1 << (bVar23 & 0x1f);
      local_528 = (VP8LBitWriter *)((long)&local_6e8->bits_ + local_6a8 + local_6b8 + local_6f8);
      lVar30 = (ulong)((iVar35 + iVar20) - 1U >> (bVar23 & 0x1f)) *
               (ulong)((uVar18 + iVar35) - 1 >> (bVar23 & 0x1f));
      local_530 = (WebPPicture *)
                  ((long)local_6f0 +
                  (long)local_6e0->palette_ + lVar30 * 0x1e75768 + local_6c0 + local_6d0 + -0x68);
      local_520 = (VP8LEncoder *)
                  ((long)local_6f0 +
                  (long)local_6e0->palette_ + lVar30 * 0x24ae00d + local_6a0 + local_6b0 + -0x68);
      local_518 = (long)iVar26 * 0x4000000 + local_698;
      uVar39 = 1;
      uVar28 = 0;
      uVar18 = 0;
      do {
        uVar42 = uVar39 & 0xffffffff;
        uVar32 = (uint)uVar39;
        if ((&local_538)[uVar18] <= (&local_538)[uVar39]) {
          uVar42 = (ulong)uVar28;
          uVar32 = uVar18;
        }
        uVar18 = uVar32;
        uVar39 = uVar39 + 1;
        uVar28 = (uint)uVar42;
      } while (((ulong)(iVar15 < 0x101) | 4) != uVar39);
      lVar30 = 1;
      do {
        if (ptr[(ulong)(byte)AnalyzeEntropy_kHistoPairs[uVar42 * 2 + 1] * 0x100 + lVar30] != 0 ||
            ptr[(ulong)(byte)AnalyzeEntropy_kHistoPairs[uVar42 * 2] * 0x100 + lVar30] != 0) {
          uVar10 = 0;
          goto LAB_0013c13f;
        }
        lVar30 = lVar30 + 1;
      } while (lVar30 != 0x100);
      uVar10 = 1;
LAB_0013c13f:
      WebPSafeFree(ptr);
      goto LAB_0013c154;
    }
  }
  WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
  local_7f8 = (VP8LEncoder *)0x0;
LAB_0013c6fd:
  VP8LBitWriterWipeOut(&local_788);
  VP8LEncoderDelete(enc);
  VP8LEncoderDelete(local_7f8);
  return (uint)(picture->error_code == VP8_ENC_OK);
}

Assistant:

int VP8LEncodeStream(const WebPConfig* const config,
                     const WebPPicture* const picture,
                     VP8LBitWriter* const bw_main) {
  VP8LEncoder* const enc_main = VP8LEncoderNew(config, picture);
  VP8LEncoder* enc_side = NULL;
  CrunchConfig crunch_configs[CRUNCH_CONFIGS_MAX];
  int num_crunch_configs_main, num_crunch_configs_side = 0;
  int idx;
  int red_and_blue_always_zero = 0;
  WebPWorker worker_main, worker_side;
  StreamEncodeContext params_main, params_side;
  // The main thread uses picture->stats, the side thread uses stats_side.
  WebPAuxStats stats_side;
  VP8LBitWriter bw_side;
  WebPPicture picture_side;
  const WebPWorkerInterface* const worker_interface = WebPGetWorkerInterface();
  int ok_main;

  if (enc_main == NULL || !VP8LBitWriterInit(&bw_side, 0)) {
    VP8LEncoderDelete(enc_main);
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }

  // Avoid "garbage value" error from Clang's static analysis tool.
  if (!WebPPictureInit(&picture_side)) {
    goto Error;
  }

  // Analyze image (entropy, num_palettes etc)
  if (!EncoderAnalyze(enc_main, crunch_configs, &num_crunch_configs_main,
                      &red_and_blue_always_zero) ||
      !EncoderInit(enc_main)) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // Split the configs between the main and side threads (if any).
  if (config->thread_level > 0) {
    num_crunch_configs_side = num_crunch_configs_main / 2;
    for (idx = 0; idx < num_crunch_configs_side; ++idx) {
      params_side.crunch_configs_[idx] =
          crunch_configs[num_crunch_configs_main - num_crunch_configs_side +
                         idx];
    }
    params_side.num_crunch_configs_ = num_crunch_configs_side;
  }
  num_crunch_configs_main -= num_crunch_configs_side;
  for (idx = 0; idx < num_crunch_configs_main; ++idx) {
    params_main.crunch_configs_[idx] = crunch_configs[idx];
  }
  params_main.num_crunch_configs_ = num_crunch_configs_main;

  // Fill in the parameters for the thread workers.
  {
    const int params_size = (num_crunch_configs_side > 0) ? 2 : 1;
    for (idx = 0; idx < params_size; ++idx) {
      // Create the parameters for each worker.
      WebPWorker* const worker = (idx == 0) ? &worker_main : &worker_side;
      StreamEncodeContext* const param =
          (idx == 0) ? &params_main : &params_side;
      param->config_ = config;
      param->red_and_blue_always_zero_ = red_and_blue_always_zero;
      if (idx == 0) {
        param->picture_ = picture;
        param->stats_ = picture->stats;
        param->bw_ = bw_main;
        param->enc_ = enc_main;
      } else {
        // Create a side picture (error_code is not thread-safe).
        if (!WebPPictureView(picture, /*left=*/0, /*top=*/0, picture->width,
                             picture->height, &picture_side)) {
          assert(0);
        }
        picture_side.progress_hook = NULL;  // Progress hook is not thread-safe.
        param->picture_ = &picture_side;  // No need to free a view afterwards.
        param->stats_ = (picture->stats == NULL) ? NULL : &stats_side;
        // Create a side bit writer.
        if (!VP8LBitWriterClone(bw_main, &bw_side)) {
          WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
          goto Error;
        }
        param->bw_ = &bw_side;
        // Create a side encoder.
        enc_side = VP8LEncoderNew(config, &picture_side);
        if (enc_side == NULL || !EncoderInit(enc_side)) {
          WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
          goto Error;
        }
        // Copy the values that were computed for the main encoder.
        enc_side->histo_bits_ = enc_main->histo_bits_;
        enc_side->predictor_transform_bits_ =
            enc_main->predictor_transform_bits_;
        enc_side->cross_color_transform_bits_ =
            enc_main->cross_color_transform_bits_;
        enc_side->palette_size_ = enc_main->palette_size_;
        memcpy(enc_side->palette_, enc_main->palette_,
               sizeof(enc_main->palette_));
        memcpy(enc_side->palette_sorted_, enc_main->palette_sorted_,
               sizeof(enc_main->palette_sorted_));
        param->enc_ = enc_side;
      }
      // Create the workers.
      worker_interface->Init(worker);
      worker->data1 = param;
      worker->data2 = NULL;
      worker->hook = EncodeStreamHook;
    }
  }

  // Start the second thread if needed.
  if (num_crunch_configs_side != 0) {
    if (!worker_interface->Reset(&worker_side)) {
      WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
      goto Error;
    }
#if !defined(WEBP_DISABLE_STATS)
    // This line is here and not in the param initialization above to remove a
    // Clang static analyzer warning.
    if (picture->stats != NULL) {
      memcpy(&stats_side, picture->stats, sizeof(stats_side));
    }
#endif
    worker_interface->Launch(&worker_side);
  }
  // Execute the main thread.
  worker_interface->Execute(&worker_main);
  ok_main = worker_interface->Sync(&worker_main);
  worker_interface->End(&worker_main);
  if (num_crunch_configs_side != 0) {
    // Wait for the second thread.
    const int ok_side = worker_interface->Sync(&worker_side);
    worker_interface->End(&worker_side);
    if (!ok_main || !ok_side) {
      if (picture->error_code == VP8_ENC_OK) {
        assert(picture_side.error_code != VP8_ENC_OK);
        WebPEncodingSetError(picture, picture_side.error_code);
      }
      goto Error;
    }
    if (VP8LBitWriterNumBytes(&bw_side) < VP8LBitWriterNumBytes(bw_main)) {
      VP8LBitWriterSwap(bw_main, &bw_side);
#if !defined(WEBP_DISABLE_STATS)
      if (picture->stats != NULL) {
        memcpy(picture->stats, &stats_side, sizeof(*picture->stats));
      }
#endif
    }
  }

 Error:
  VP8LBitWriterWipeOut(&bw_side);
  VP8LEncoderDelete(enc_main);
  VP8LEncoderDelete(enc_side);
  return (picture->error_code == VP8_ENC_OK);
}